

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall cmELF::~cmELF(cmELF *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmELFInternal_*,_false> _Var3;
  pointer *__ptr;
  
  pcVar2 = (this->ErrorMessage)._M_dataplus._M_p;
  paVar1 = &(this->ErrorMessage).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  _Var3._M_head_impl =
       (this->Internal)._M_t.
       super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
       super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
       super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (cmELFInternal *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_cmELFInternal + 8))();
  }
  (this->Internal)._M_t.super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>.
  _M_t.super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
  super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl = (cmELFInternal *)0x0;
  return;
}

Assistant:

cmELF::~cmELF() = default;